

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core_c.cc
# Opt level: O0

int TimeToFrequencyDomain
              (AecmCore *aecm,int16_t *time_signal,ComplexInt16 *freq_signal,
              uint16_t *freq_signal_abs,uint32_t *freq_signal_sum_abs)

{
  int16_t iVar1;
  int32_t iVar2;
  short local_28c;
  short local_288;
  uint16_t local_284;
  uint16_t local_280;
  uint16_t local_27c;
  uint16_t local_278;
  int16_t tmp16no2;
  int16_t tmp16no1;
  int16_t *fft;
  int16_t fft_buf [272];
  int32_t tmp32no2;
  int32_t tmp32no1;
  int time_signal_scaling;
  int i;
  uint32_t *freq_signal_sum_abs_local;
  uint16_t *freq_signal_abs_local;
  ComplexInt16 *freq_signal_local;
  int16_t *time_signal_local;
  AecmCore *aecm_local;
  
  iVar1 = (*WebRtcSpl_MaxAbsValueW16)(time_signal,0x80);
  iVar1 = WebRtcSpl_NormW16(iVar1);
  WindowAndFFT(aecm,fft_buf,time_signal,freq_signal,(int)iVar1);
  freq_signal->imag = 0;
  freq_signal[0x40].imag = 0;
  if (freq_signal->real < 0) {
    local_278 = -freq_signal->real;
  }
  else {
    local_278 = freq_signal->real;
  }
  *freq_signal_abs = local_278;
  if (freq_signal[0x40].real < 0) {
    local_27c = -freq_signal[0x40].real;
  }
  else {
    local_27c = freq_signal[0x40].real;
  }
  freq_signal_abs[0x40] = local_27c;
  *freq_signal_sum_abs = (uint)*freq_signal_abs + (uint)freq_signal_abs[0x40];
  for (tmp32no1 = 1; tmp32no1 < 0x40; tmp32no1 = tmp32no1 + 1) {
    if (freq_signal[tmp32no1].real == 0) {
      if (freq_signal[tmp32no1].imag < 0) {
        local_280 = -freq_signal[tmp32no1].imag;
      }
      else {
        local_280 = freq_signal[tmp32no1].imag;
      }
      freq_signal_abs[tmp32no1] = local_280;
    }
    else if (freq_signal[tmp32no1].imag == 0) {
      if (freq_signal[tmp32no1].real < 0) {
        local_284 = -freq_signal[tmp32no1].real;
      }
      else {
        local_284 = freq_signal[tmp32no1].real;
      }
      freq_signal_abs[tmp32no1] = local_284;
    }
    else {
      if (freq_signal[tmp32no1].real < 0) {
        local_288 = -freq_signal[tmp32no1].real;
      }
      else {
        local_288 = freq_signal[tmp32no1].real;
      }
      if (freq_signal[tmp32no1].imag < 0) {
        local_28c = -freq_signal[tmp32no1].imag;
      }
      else {
        local_28c = freq_signal[tmp32no1].imag;
      }
      iVar2 = WebRtcSpl_AddSatW32((int)local_288 * (int)local_288,(int)local_28c * (int)local_28c);
      iVar2 = WebRtcSpl_SqrtFloor(iVar2);
      freq_signal_abs[tmp32no1] = (uint16_t)iVar2;
    }
    *freq_signal_sum_abs = (uint)freq_signal_abs[tmp32no1] + *freq_signal_sum_abs;
  }
  return (int)iVar1;
}

Assistant:

static int TimeToFrequencyDomain(AecmCore* aecm,
                                 const int16_t* time_signal,
                                 ComplexInt16* freq_signal,
                                 uint16_t* freq_signal_abs,
                                 uint32_t* freq_signal_sum_abs) {
  int i = 0;
  int time_signal_scaling = 0;

  int32_t tmp32no1 = 0;
  int32_t tmp32no2 = 0;

  // In fft_buf, +16 for 32-byte alignment.
  int16_t fft_buf[PART_LEN4 + 16];
  int16_t *fft = (int16_t *) (((uintptr_t) fft_buf + 31) & ~31);

  int16_t tmp16no1;
#ifndef WEBRTC_ARCH_ARM_V7
  int16_t tmp16no2;
#endif
#ifdef AECM_WITH_ABS_APPROX
  int16_t max_value = 0;
  int16_t min_value = 0;
  uint16_t alpha = 0;
  uint16_t beta = 0;
#endif

#ifdef AECM_DYNAMIC_Q
  tmp16no1 = WebRtcSpl_MaxAbsValueW16(time_signal, PART_LEN2);
  time_signal_scaling = WebRtcSpl_NormW16(tmp16no1);
#endif

  WindowAndFFT(aecm, fft, time_signal, freq_signal, time_signal_scaling);

  // Extract imaginary and real part, calculate the magnitude for
  // all frequency bins
  freq_signal[0].imag = 0;
  freq_signal[PART_LEN].imag = 0;
  freq_signal_abs[0] = (uint16_t)WEBRTC_SPL_ABS_W16(freq_signal[0].real);
  freq_signal_abs[PART_LEN] = (uint16_t)WEBRTC_SPL_ABS_W16(
                                freq_signal[PART_LEN].real);
  (*freq_signal_sum_abs) = (uint32_t)(freq_signal_abs[0]) +
                           (uint32_t)(freq_signal_abs[PART_LEN]);

  for (i = 1; i < PART_LEN; i++)
  {
    if (freq_signal[i].real == 0)
    {
      freq_signal_abs[i] = (uint16_t)WEBRTC_SPL_ABS_W16(freq_signal[i].imag);
    }
    else if (freq_signal[i].imag == 0)
    {
      freq_signal_abs[i] = (uint16_t)WEBRTC_SPL_ABS_W16(freq_signal[i].real);
    }
    else
    {
      // Approximation for magnitude of complex fft output
      // magn = sqrt(real^2 + imag^2)
      // magn ~= alpha * max(|imag|,|real|) + beta * min(|imag|,|real|)
      //
      // The parameters alpha and beta are stored in Q15

#ifdef AECM_WITH_ABS_APPROX
      tmp16no1 = WEBRTC_SPL_ABS_W16(freq_signal[i].real);
      tmp16no2 = WEBRTC_SPL_ABS_W16(freq_signal[i].imag);

      if(tmp16no1 > tmp16no2)
      {
        max_value = tmp16no1;
        min_value = tmp16no2;
      } else
      {
        max_value = tmp16no2;
        min_value = tmp16no1;
      }

      // Magnitude in Q(-6)
      if ((max_value >> 2) > min_value)
      {
        alpha = kAlpha1;
        beta = kBeta1;
      } else if ((max_value >> 1) > min_value)
      {
        alpha = kAlpha2;
        beta = kBeta2;
      } else
      {
        alpha = kAlpha3;
        beta = kBeta3;
      }
      tmp16no1 = (int16_t)((max_value * alpha) >> 15);
      tmp16no2 = (int16_t)((min_value * beta) >> 15);
      freq_signal_abs[i] = (uint16_t)tmp16no1 + (uint16_t)tmp16no2;
#else
#ifdef WEBRTC_ARCH_ARM_V7
      __asm __volatile(
        "smulbb %[tmp32no1], %[real], %[real]\n\t"
        "smlabb %[tmp32no2], %[imag], %[imag], %[tmp32no1]\n\t"
        :[tmp32no1]"+&r"(tmp32no1),
         [tmp32no2]"=r"(tmp32no2)
        :[real]"r"(freq_signal[i].real),
         [imag]"r"(freq_signal[i].imag)
      );
#else
      tmp16no1 = WEBRTC_SPL_ABS_W16(freq_signal[i].real);
      tmp16no2 = WEBRTC_SPL_ABS_W16(freq_signal[i].imag);
      tmp32no1 = tmp16no1 * tmp16no1;
      tmp32no2 = tmp16no2 * tmp16no2;
      tmp32no2 = WebRtcSpl_AddSatW32(tmp32no1, tmp32no2);
#endif // WEBRTC_ARCH_ARM_V7
      tmp32no1 = WebRtcSpl_SqrtFloor(tmp32no2);

      freq_signal_abs[i] = (uint16_t)tmp32no1;
#endif // AECM_WITH_ABS_APPROX
    }
    (*freq_signal_sum_abs) += (uint32_t)freq_signal_abs[i];
  }

  return time_signal_scaling;
}